

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O3

void anon_unknown.dwarf_5bb09::test(_func_M44f_M44f_ptr_Order *matrixEulerMatrix,Order order)

{
  float fVar1;
  int iVar2;
  long *plVar3;
  float (*pafVar4) [4];
  byte bVar5;
  int i;
  int j_1;
  int j;
  long lVar6;
  int k;
  uint uVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  double dVar11;
  Rand48 r;
  M44f M;
  Euler<float> local_138;
  double local_128;
  double local_118;
  ulong local_100;
  float local_f8 [2];
  ulong uStack_f0;
  float local_e8 [2];
  float afStack_e0 [2];
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8 [2];
  float afStack_c0 [2];
  M44f local_b8;
  M44f local_78;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"order = ",8);
  *(uint *)(Imath_3_2::procrustesRotationAndTranslation<double> + *(long *)(std::cout + -0x18)) =
       *(uint *)(Imath_3_2::procrustesRotationAndTranslation<double> + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  plVar3 = (long *)std::ostream::operator<<(&std::cout,order);
  lVar6 = *plVar3;
  lVar8 = *(long *)(lVar6 + -0x18);
  *(uint *)((long)plVar3 + lVar8 + 0x18) = *(uint *)((long)plVar3 + lVar8 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  local_138.super_Vec3<float>.x = 1.5365222e+16;
  local_138.super_Vec3<float>.y = (float)CONCAT22(local_138.super_Vec3<float>.y._2_2_,0x5a5a);
  iVar2 = 0;
  do {
    local_118 = (double)Imath_3_2::erand48((ushort *)&local_138);
    local_128 = (double)Imath_3_2::erand48((ushort *)&local_138);
    dVar11 = (double)Imath_3_2::erand48((ushort *)&local_138);
    local_b8.x[0][1] = (float)((1.0 - local_128) * -180.0 + local_128 * 180.0) * 0.017453292;
    local_b8.x[0][0] = (float)((1.0 - local_118) * -180.0 + local_118 * 180.0) * 0.017453292;
    local_b8.x[0]._8_8_ =
         CONCAT44(local_b8.x[0][3],(float)((1.0 - dVar11) * -180.0 + dVar11 * 180.0) * 0.017453292)
         & 0xffffffe0ffffffff | 0x500000000;
    pafVar4 = (float (*) [4])local_f8;
    Imath_3_2::Euler<float>::toMatrix44((Matrix44<float> *)pafVar4,(Euler<float> *)&local_b8);
    lVar6 = 0;
    do {
      lVar8 = 0;
      do {
        dVar11 = (double)Imath_3_2::erand48((ushort *)&local_138);
        (*(float (*) [4])*pafVar4)[lVar8] =
             (float)((1.0 - dVar11) * -1e-07 + dVar11 * 1e-07) + (*(float (*) [4])*pafVar4)[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar6 = lVar6 + 1;
      pafVar4 = pafVar4 + 1;
    } while (lVar6 != 3);
    local_78.x[0][0] = local_f8[0];
    local_78.x[0][1] = local_f8[1];
    local_78.x[0][2] = (float)(undefined4)uStack_f0;
    local_78.x[0][3] = (float)uStack_f0._4_4_;
    local_78.x[1][0] = local_e8[0];
    local_78.x[1][1] = local_e8[1];
    local_78.x[1][2] = afStack_e0[0];
    local_78.x[1][3] = afStack_e0[1];
    local_78.x[2][0] = local_d8[0];
    local_78.x[2][1] = local_d8[1];
    local_78.x[2][2] = afStack_d0[0];
    local_78.x[2][3] = afStack_d0[1];
    local_78.x[3][0] = local_c8[0];
    local_78.x[3][1] = local_c8[1];
    local_78.x[3][2] = afStack_c0[0];
    local_78.x[3][3] = afStack_c0[1];
    testMatrix(&local_78,matrixEulerMatrix,order);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 100000);
  bVar5 = 0x10;
  if ((order >> 0xd & 1) == 0) {
    bVar5 = (byte)(order >> 9) & 8;
  }
  local_100 = 0;
  do {
    local_118 = (double)CONCAT44(local_118._4_4_,(float)(int)local_100 * 0.017453292);
    local_128 = 0.0;
    do {
      iVar2 = SUB84(local_128,0);
      uVar7 = 0;
      do {
        local_138.super_Vec3<float>.z = (float)(int)uVar7 * 0.017453292;
        local_138.super_Vec3<float>.x = local_118._0_4_;
        local_138.super_Vec3<float>.y = (float)iVar2 * 0.017453292;
        local_138._12_1_ = (byte)(order >> 3) & 2 | (byte)(order >> 6) & 4 | (byte)order & 1 | bVar5
        ;
        Imath_3_2::Euler<float>::toMatrix44((Matrix44<float> *)local_f8,&local_138);
        local_78.x[0][0] = local_f8[0];
        local_78.x[0][1] = local_f8[1];
        local_78.x[0][2] = (float)(undefined4)uStack_f0;
        local_78.x[0][3] = (float)uStack_f0._4_4_;
        local_78.x[1][0] = local_e8[0];
        local_78.x[1][1] = local_e8[1];
        local_78.x[1][2] = afStack_e0[0];
        local_78.x[1][3] = afStack_e0[1];
        local_78.x[2][0] = local_d8[0];
        local_78.x[2][1] = local_d8[1];
        local_78.x[2][2] = afStack_d0[0];
        local_78.x[2][3] = afStack_d0[1];
        local_78.x[3][0] = local_c8[0];
        local_78.x[3][1] = local_c8[1];
        local_78.x[3][2] = afStack_c0[0];
        local_78.x[3][3] = afStack_c0[1];
        testMatrix(&local_78,matrixEulerMatrix,order);
        lVar6 = 0;
        pafVar4 = (float (*) [4])local_f8;
        do {
          lVar8 = 0;
          do {
            fVar1 = (*(float (*) [4])*pafVar4)[lVar8];
            uVar10 = -(uint)(fVar1 < -0.5);
            (*(float (*) [4])*pafVar4)[lVar8] =
                 (float)(uVar10 & 0xbf800000 | ~uVar10 & -(uint)(0.5 < fVar1) & 0x3f800000);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar6 = lVar6 + 1;
          pafVar4 = pafVar4 + 1;
        } while (lVar6 != 3);
        local_b8.x[0][0] = local_f8[0];
        local_b8.x[0][1] = local_f8[1];
        local_b8.x[0][2] = (float)(undefined4)uStack_f0;
        local_b8.x[0][3] = (float)uStack_f0._4_4_;
        local_b8.x[1][0] = local_e8[0];
        local_b8.x[1][1] = local_e8[1];
        local_b8.x[1][2] = afStack_e0[0];
        local_b8.x[1][3] = afStack_e0[1];
        local_b8.x[2][0] = local_d8[0];
        local_b8.x[2][1] = local_d8[1];
        local_b8.x[2][2] = afStack_d0[0];
        local_b8.x[2][3] = afStack_d0[1];
        local_b8.x[3][0] = local_c8[0];
        local_b8.x[3][1] = local_c8[1];
        local_b8.x[3][2] = afStack_c0[0];
        local_b8.x[3][3] = afStack_c0[1];
        testMatrix(&local_b8,matrixEulerMatrix,order);
        bVar9 = uVar7 < 0x10e;
        uVar7 = uVar7 + 0x5a;
      } while (bVar9);
      uVar7 = SUB84(local_128,0);
      local_128 = (double)(ulong)(uVar7 + 0x5a);
    } while (uVar7 < 0x10e);
    uVar7 = (uint)local_100;
    local_100 = (ulong)(uVar7 + 0x5a);
  } while (uVar7 < 0x10e);
  return;
}

Assistant:

void
test (
    M44f (*matrixEulerMatrix) (const M44f&, Eulerf::Order), Eulerf::Order order)
{
    cout << "order = " << setbase (16) << int (order) << setbase (10) << endl;

    // cout << "random angles" << endl;

    testRandomAngles (matrixEulerMatrix, order);

    // cout << "special angles" << endl;

    for (int i = 0; i < 360; i += 90)
        for (int j = 0; j < 360; j += 90)
            for (int k = 0; k < 360; k += 90)
                testAngles (V3f (float(i), float(j), float(k)), matrixEulerMatrix, order);
}